

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O0

void Abc_QuickSort3Dec_rec(word *pData,int l,int r)

{
  word wVar1;
  word wVar2;
  int iVar3;
  uint uVar4;
  word t_5;
  word t_4;
  word t_3;
  word t_2;
  word t_1;
  word t;
  int local_30;
  int q;
  int p;
  int j;
  int i;
  int k;
  word v;
  int r_local;
  int l_local;
  word *pData_local;
  
  wVar1 = pData[r];
  local_30 = l + -1;
  if (l < r) {
    if (r <= l) {
      __assert_fail("l < r",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilSort.c"
                    ,0x278,"void Abc_QuickSort3Dec_rec(word *, int, int)");
    }
    iVar3 = l + -1;
    q = r;
    t._4_4_ = r;
    if (r - l < 10) {
      Abc_SelectSortDec(pData + l,(r - l) + 1);
    }
    else {
LAB_00536f47:
      do {
        p = iVar3;
        iVar3 = p + 1;
        uVar4 = (uint)wVar1;
      } while (uVar4 < (uint)pData[iVar3]);
      do {
        q = q + -1;
        if (uVar4 <= (uint)pData[q]) break;
      } while (q != l);
      if (iVar3 < q) {
        wVar2 = pData[iVar3];
        pData[iVar3] = pData[q];
        pData[q] = wVar2;
        if ((uint)pData[iVar3] == uVar4) {
          local_30 = local_30 + 1;
          wVar2 = pData[local_30];
          pData[local_30] = pData[iVar3];
          pData[iVar3] = wVar2;
        }
        if (uVar4 == (uint)pData[q]) {
          t._4_4_ = t._4_4_ + -1;
          wVar2 = pData[q];
          pData[q] = pData[t._4_4_];
          pData[t._4_4_] = wVar2;
        }
        goto LAB_00536f47;
      }
      wVar1 = pData[iVar3];
      pData[iVar3] = pData[r];
      pData[r] = wVar1;
      q = p;
      p = p + 2;
      for (j = l; j < local_30; j = j + 1) {
        wVar1 = pData[j];
        pData[j] = pData[q];
        pData[q] = wVar1;
        q = q + -1;
      }
      for (j = r + -1; t._4_4_ < j; j = j + -1) {
        wVar1 = pData[p];
        pData[p] = pData[j];
        pData[j] = wVar1;
        p = p + 1;
      }
      Abc_QuickSort3Dec_rec(pData,l,q);
      Abc_QuickSort3Dec_rec(pData,p,r);
    }
  }
  return;
}

Assistant:

void Abc_QuickSort3Dec_rec( word * pData, int l, int r )
{
    word v = pData[r];
    int k, i = l-1, j = r, p = l-1, q = r;
    if ( l >= r )
        return;
    assert( l < r );
    if ( r - l < 10 )
    {
        Abc_SelectSortDec( pData + l, r - l + 1 );
        return;
    }
    while ( 1 )
    {
        while ( (unsigned)pData[++i] > (unsigned)v );
        while ( (unsigned)v > (unsigned)pData[--j] )
            if ( j == l )
                break;
        if ( i >= j )
            break;
        ABC_SWAP( word, pData[i], pData[j] );
        if ( (unsigned)pData[i] == (unsigned)v ) 
            { p++; ABC_SWAP( word, pData[p], pData[i] ); }
        if ( (unsigned)v == (unsigned)pData[j] ) 
            { q--; ABC_SWAP( word, pData[j], pData[q] ); }
    }
    ABC_SWAP( word, pData[i], pData[r] ); 
    j = i-1; i = i+1;
    for ( k = l; k < p; k++, j-- ) 
        ABC_SWAP( word, pData[k], pData[j] );
    for ( k = r-1; k > q; k--, i++ ) 
        ABC_SWAP( word, pData[i], pData[k] );
    Abc_QuickSort3Dec_rec( pData, l, j );
    Abc_QuickSort3Dec_rec( pData, i, r );
}